

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.h
# Opt level: O0

void __thiscall
Init::ExecuteCommandOptions::reflect(ExecuteCommandOptions *this,StringWriter *writer)

{
  StringWriter *writer_00;
  allocator<char> local_39;
  string local_38;
  StringWriter *local_18;
  StringWriter *writer_local;
  ExecuteCommandOptions *this_local;
  
  local_18 = writer;
  writer_local = (StringWriter *)this;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(writer);
  writer_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"commands",&local_39);
  reflectVector<std::__cxx11::string>(writer_00,&local_38,&this->commands,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(local_18,0);
  return;
}

Assistant:

void reflect (StringWriter &writer) override {
            writer.StartObject();
            reflectVector(writer, "commands", commands);
            writer.EndObject();
        }